

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pocman.cpp
# Opt level: O3

void __thiscall despot::Pocman::NewLevel(Pocman *this,PocmanState *pocstate)

{
  Grid<int> *this_00;
  ulong *puVar1;
  byte bVar2;
  undefined7 uVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  byte *pbVar7;
  pointer pCVar8;
  int x;
  int iVar9;
  double dVar10;
  
  uVar3 = *(undefined7 *)&this->field_0x3d;
  pocstate->pocman_pos = this->pocman_home_;
  *(undefined7 *)&pocstate->field_0x21 = uVar3;
  if (0 < this->num_ghosts_) {
    pCVar8 = (pocstate->ghost_pos).super__Vector_base<despot::Coord,_std::allocator<despot::Coord>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar6 = 0;
    do {
      *(undefined8 *)(pCVar8 + uVar6 * 8) = *(undefined8 *)&this->ghost_home_;
      pCVar8 = (pocstate->ghost_pos).
               super__Vector_base<despot::Coord,_std::allocator<despot::Coord>_>._M_impl.
               super__Vector_impl_data._M_start;
      *(uint *)(pCVar8 + uVar6 * 8) = *(int *)(pCVar8 + uVar6 * 8) + ((uint)uVar6 & 1);
      *(uint *)(pCVar8 + uVar6 * 8 + 4) =
           *(int *)(pCVar8 + uVar6 * 8 + 4) + ((uint)(uVar6 >> 1) & 0x7fffffff);
      (pocstate->ghost_dir).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start[uVar6] = -1;
      uVar6 = uVar6 + 1;
    } while ((long)uVar6 < (long)this->num_ghosts_);
  }
  pocstate->num_food = 0;
  iVar9 = (this->maze_).xsize_;
  if (0 < iVar9) {
    this_00 = &this->maze_;
    iVar4 = (this->maze_).ysize_;
    x = 0;
    do {
      if (0 < iVar4) {
        iVar9 = 0;
        do {
          iVar4 = Grid<int>::Index(this_00,x,iVar9);
          pbVar7 = (byte *)Grid<int>::operator()(this_00,x,iVar9);
          if ((*pbVar7 & 2) == 0) {
LAB_00109601:
            iVar5 = iVar4 + 0x3f;
            if (-1 < iVar4) {
              iVar5 = iVar4;
            }
            bVar2 = (byte)iVar4 & 0x3f;
            puVar1 = (pocstate->food).super__Bvector_base<std::allocator<bool>_>._M_impl.
                     super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p +
                     (long)(iVar5 >> 6) +
                     (ulong)(((long)iVar4 & 0x800000000000003fU) < 0x8000000000000001) +
                     0xffffffffffffffff;
            *puVar1 = *puVar1 & (-2L << bVar2 | 0xfffffffffffffffeU >> 0x40 - bVar2);
          }
          else {
            pbVar7 = (byte *)Grid<int>::operator()(this_00,x,iVar9);
            if ((*pbVar7 & 4) == 0) {
              dVar10 = (double)despot::Random::NextDouble();
              if (this->food_prob_ <= dVar10) goto LAB_00109601;
            }
            iVar5 = iVar4 + 0x3f;
            if (-1 < iVar4) {
              iVar5 = iVar4;
            }
            puVar1 = (pocstate->food).super__Bvector_base<std::allocator<bool>_>._M_impl.
                     super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p +
                     (long)(iVar5 >> 6) +
                     (ulong)(((long)iVar4 & 0x800000000000003fU) < 0x8000000000000001) +
                     0xffffffffffffffff;
            *puVar1 = *puVar1 | 1L << ((byte)iVar4 & 0x3f);
            pocstate->num_food = pocstate->num_food + 1;
          }
          iVar9 = iVar9 + 1;
          iVar4 = (this->maze_).ysize_;
        } while (iVar9 < iVar4);
        iVar9 = this_00->xsize_;
      }
      x = x + 1;
    } while (x < iVar9);
  }
  pocstate->power_steps = 0;
  return;
}

Assistant:

void Pocman::NewLevel(PocmanState& pocstate) const {
	pocstate.pocman_pos = pocman_home_;
	for (int g = 0; g < num_ghosts_; g++) {
		pocstate.ghost_pos[g] = ghost_home_;
		pocstate.ghost_pos[g].x += g % 2;
		pocstate.ghost_pos[g].y += g / 2;
		pocstate.ghost_dir[g] = -1;
	}

	pocstate.num_food = 0;
	for (int x = 0; x < maze_.xsize(); x++) {
		for (int y = 0; y < maze_.ysize(); y++) {
			int pocIndex = maze_.Index(x, y);
			// cout << maze_(x, y) << " " << CheckFlag(maze_(x, y), E_SEED) << " " << CheckFlag(maze_(x, y), E_POWER) << endl;
			if (CheckFlag(maze_(x, y), E_SEED)
				&& (CheckFlag(maze_(x, y), E_POWER)
					|| Random::RANDOM.NextDouble() < food_prob_)) {
				pocstate.food[pocIndex] = 1;
				pocstate.num_food++;
			} else {
				pocstate.food[pocIndex] = 0;
			}
		}
	}

	pocstate.power_steps = 0;
}